

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_0::Btree_TryEmplaceWithHintWorks_Test::TestBody
          (Btree_TryEmplaceWithHintWorks_Test *this)

{
  node_type *pnVar1;
  node_type nVar2;
  byte bVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [8];
  uint uVar6;
  _Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  _Var7;
  _Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
  _Var8;
  Type TVar9;
  btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  bVar10;
  bool bVar11;
  _Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
  this_00;
  _Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
  _Var12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *right;
  btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *pbVar15;
  uint uVar16;
  uint uVar17;
  char *pcVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  allocator_type *alloc;
  int iVar23;
  tuple<int_&> *in_R9;
  undefined1 auVar24 [8];
  undefined1 auVar25 [8];
  const_iterator hint;
  iterator iter;
  iterator iter_00;
  const_iterator hint_00;
  const_iterator hint_01;
  iterator iVar26;
  iterator iVar27;
  iterator iVar28;
  iterator iVar29;
  int calls;
  pair<int,_int> pair1024;
  AssertHelper local_c0;
  undefined1 local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_b0;
  undefined1 local_a8 [8];
  uint uStack_a0;
  undefined4 uStack_9c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  int local_88;
  node_type local_81;
  btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  local_80;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
  local_60;
  _Head_base<0UL,_const_int_&,_false> local_50;
  undefined8 local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  uint local_34;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar13;
  
  local_80.root_.
  super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
  ._M_head_impl.calls = (type)&local_88;
  local_88 = 0;
  local_80.root_.
  super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        )&btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::$_0,std::allocator<std::pair<int_const,int>>,256,false>>
          ::EmptyNode()::empty_node;
  local_80.rightmost_ =
       (node_type *)
       &btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::$_0,std::allocator<std::pair<int_const,int>>,256,false>>
        ::EmptyNode()::empty_node;
  local_80.size_ = 0;
  iVar21 = 0;
  do {
    local_b8._4_4_ = iVar21;
    local_b8._0_4_ = iVar21;
    btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::$_0,std::allocator<std::pair<int_const,int>>,256,false>>
    ::insert_unique<std::pair<int,int>>
              ((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_bool>
                *)local_a8,
               (btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::__0,std::allocator<std::pair<int_const,int>>,256,false>>
                *)&local_80,(key_type *)local_b8,(pair<int,_int> *)local_b8);
    iVar21 = iVar21 + 1;
  } while (iVar21 != 0x80);
  local_88 = 0;
  local_b8 = (undefined1  [8])0x7f0000007f;
  btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::$_0,std::allocator<std::pair<int_const,int>>,256,false>>
  ::insert_unique<std::pair<int,int>>
            ((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_bool>
              *)local_a8,
             (btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::__0,std::allocator<std::pair<int_const,int>>,256,false>>
              *)&local_80,(key_type *)local_b8,(pair<int,_int> *)local_b8);
  local_b8._0_4_ = 4;
  testing::internal::CmpHelperGE<int,int>
            ((internal *)local_a8,"calls","4",&local_88,(int *)local_b8);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if ((undefined8 *)CONCAT44(uStack_9c,uStack_a0) == (undefined8 *)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)CONCAT44(uStack_9c,uStack_a0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x884,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(ulong *)local_b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_9c,uStack_a0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_9c,uStack_a0));
  }
  local_88 = 0;
  if (((ulong)local_80.root_.
              super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
              .
              super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
              .
              super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
              .
              super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
              ._M_head_impl & 7) == 0) {
    local_a8._0_4_ = 0xffffffff;
    local_b8._0_4_ = 0xffffffff;
    hint._8_8_ = 0;
    hint.node = (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                 *)*(ulong *)local_80.root_.
                             super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                             .
                             super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                             .
                             super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                             .
                             super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                             ._M_head_impl;
    iVar26 = btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
             ::try_emplace<int>((btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                                 *)&local_80,hint,(key_type *)local_a8,(int *)local_b8);
    local_60.node = iVar26.node;
    local_60.position = iVar26.position;
    local_c0.data_._0_4_ = 0x81;
    local_b8 = (undefined1  [8])local_80.size_;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)local_a8,"129","m.size()",(int *)&local_c0,(unsigned_long *)local_b8);
    if (local_a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_b8);
      if ((undefined8 *)CONCAT44(uStack_9c,uStack_a0) == (undefined8 *)0x0) {
        pcVar18 = "";
      }
      else {
        pcVar18 = *(char **)CONCAT44(uStack_9c,uStack_a0);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x889,pcVar18);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if (local_b8 != (undefined1  [8])0x0) {
        (**(code **)(*(ulong *)local_b8 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(uStack_9c,uStack_a0) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uStack_9c,uStack_a0));
    }
    if (((ulong)local_80.root_.
                super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                .
                super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                .
                super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                .
                super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                ._M_head_impl & 7) == 0) {
      local_b8 = *(undefined1 (*) [8])
                  local_80.root_.
                  super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                  .
                  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                  .
                  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                  .
                  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                  ._M_head_impl;
      pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)pbStack_b0 & 0xffffffff00000000);
      testing::internal::EqHelper::
      Compare<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_nullptr>
                (local_a8,"m.begin()",&local_60,
                 (btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                  *)local_b8);
      if (local_a8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_b8);
        if ((undefined8 *)CONCAT44(uStack_9c,uStack_a0) == (undefined8 *)0x0) {
          pcVar18 = "";
        }
        else {
          pcVar18 = *(char **)CONCAT44(uStack_9c,uStack_a0);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x88a,pcVar18);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_b8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_b8 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(uStack_9c,uStack_a0) !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&uStack_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uStack_9c,uStack_a0));
      }
      local_b8._0_4_ = 2;
      testing::internal::CmpHelperLE<int,int>
                ((internal *)local_a8,"calls","2",&local_88,(int *)local_b8);
      if (local_a8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_b8);
        if ((undefined8 *)CONCAT44(uStack_9c,uStack_a0) == (undefined8 *)0x0) {
          pcVar18 = "";
        }
        else {
          pcVar18 = *(char **)CONCAT44(uStack_9c,uStack_a0);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x88b,pcVar18);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_b8 != (undefined1  [8])0x0) {
          (**(code **)(*(ulong *)local_b8 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(uStack_9c,uStack_a0) !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&uStack_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uStack_9c,uStack_a0));
      }
      _Var12._M_head_impl = local_80.rightmost_;
      _Var8._M_head_impl.calls =
           local_80.root_.
           super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
           .
           super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
           ._M_head_impl.calls;
      local_88 = 0;
      local_48 = 0x40000000400;
      if (((ulong)local_80.rightmost_ & 7) == 0) {
        local_50._M_head_impl = (int *)((long)&local_48 + 4);
        nVar2 = local_80.rightmost_[10];
        local_c0.data_ = (AssertHelperData *)&local_48;
        local_a8 = (undefined1  [8])local_80.rightmost_;
        uVar20 = (uint)(byte)nVar2;
        uStack_a0 = uVar20;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80.size_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          if (local_80.rightmost_[10] != nVar2) {
            iVar21 = *(int *)(local_80.rightmost_ + (ulong)(byte)nVar2 * 8 + 0xc);
            iVar23 = *(int *)local_80.root_.
                             super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                             .
                             super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
                             ._M_head_impl.calls;
            *(int *)local_80.root_.
                    super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                    .
                    super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
                    ._M_head_impl.calls = iVar23 + 1;
            if (0x400 < iVar21) goto LAB_001d5b88;
            iVar21 = *(int *)(_Var12._M_head_impl + (long)(int)uVar20 * 8 + 0xc);
            TVar9 = (Type)local_48;
            *(int *)_Var8._M_head_impl.calls = iVar23 + 2;
            if (iVar21 < (int)TVar9) {
              btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
              ::operator++((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                            *)local_a8);
              if (((ulong)local_80.rightmost_ & 7) != 0) goto LAB_001d6c09;
              uVar19 = (ulong)(byte)local_80.rightmost_[10];
              if (local_a8 == (undefined1  [8])local_80.rightmost_ &&
                  uStack_a0 == (byte)local_80.rightmost_[10]) {
LAB_001d5c7d:
                iVar27._8_8_ = uVar19;
                iVar27.node = (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                               *)local_a8;
                iVar27 = btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::$_0,std::allocator<std::pair<int_const,int>>,256,false>>
                         ::
                         internal_emplace<std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<int&>>
                                   ((btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::__0,std::allocator<std::pair<int_const,int>>,256,false>>
                                     *)&local_80,iVar27,(piecewise_construct_t *)&local_c0,
                                    (tuple<const_int_&> *)&local_50,in_R9);
                auVar4 = iVar27._0_12_;
                goto LAB_001d5d7f;
              }
              if (((ulong)local_a8 & 7) == 0) {
                TVar9 = (Type)local_48;
                iVar21 = *(int *)((long)local_a8 + (long)(int)uStack_a0 * 8 + 0xc);
                *(int *)local_80.root_.
                        super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                        .
                        super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
                        ._M_head_impl.calls =
                     *(int *)local_80.root_.
                             super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                             .
                             super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
                             ._M_head_impl.calls + 1;
                if ((int)TVar9 < iVar21) {
                  uVar19 = (ulong)uStack_a0;
                  goto LAB_001d5c7d;
                }
                goto LAB_001d5c96;
              }
LAB_001d6c94:
              pcVar18 = 
              "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
              ;
              goto LAB_001d6c1e;
            }
            goto LAB_001d5d84;
          }
LAB_001d5b88:
          pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uStack_9c,uVar20);
          local_b8 = (undefined1  [8])_Var12._M_head_impl;
          if (((ulong)local_80.root_.
                      super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                      .
                      super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                      .
                      super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                      .
                      super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                      ._M_head_impl & 7) == 0) {
            if (((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )*(__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_80.root_.
                       super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                       .
                       super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                       .
                       super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                       .
                       super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                       ._M_head_impl !=
                 (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )_Var12._M_head_impl) || (uVar19 = 0, uVar20 != 0)) {
              btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
              ::operator--((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                            *)local_b8);
              if (((ulong)local_b8 & 7) != 0) goto LAB_001d6c94;
              iVar21 = *(int *)((long)local_b8 + (long)(int)(uint)pbStack_b0 * 8 + 0xc);
              TVar9 = (Type)local_48;
              *(int *)local_80.root_.
                      super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                      .
                      super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
                      ._M_head_impl.calls =
                   *(int *)local_80.root_.
                           super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                           .
                           super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
                           ._M_head_impl.calls + 1;
              if ((int)TVar9 <= iVar21) {
LAB_001d5c96:
                this_00._M_head_impl =
                     (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                      *)local_80.root_.
                        super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                        .
                        super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_80.size_ ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) goto LAB_001d5ca5;
                goto LAB_001d5ccb;
              }
              uVar19 = (ulong)uStack_a0;
            }
            iter._8_8_ = uVar19;
            iter.node = (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                         *)local_a8;
            iVar27 = btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::$_0,std::allocator<std::pair<int_const,int>>,256,false>>
                     ::
                     internal_emplace<std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<int&>>
                               ((btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::__0,std::allocator<std::pair<int_const,int>>,256,false>>
                                 *)&local_80,iter,(piecewise_construct_t *)&local_c0,
                                (tuple<const_int_&> *)&local_50,in_R9);
            auVar4 = iVar27._0_12_;
            goto LAB_001d5d7f;
          }
          goto LAB_001d6c3f;
        }
LAB_001d5ca5:
        local_80.root_.
        super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
        ._M_head_impl =
             (_Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
              )btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
               ::new_leaf_root_node(&local_80,1);
        this_00._M_head_impl =
             (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              *)local_80.root_.
                super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                .
                super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                .
                super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                .
                super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                ._M_head_impl;
        local_80.rightmost_ =
             (node_type *)
             local_80.root_.
             super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
             .
             super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
             .
             super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
             .
             super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
             ._M_head_impl;
LAB_001d5ccb:
        for (; _Var8._M_head_impl.calls =
                    local_80.root_.
                    super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                    .
                    super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
                    ._M_head_impl.calls, ((ulong)this_00._M_head_impl & 7) == 0;
            this_00._M_head_impl =
                 btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                 ::child(this_00._M_head_impl,(long)(int)uVar19)) {
          uVar19 = (ulong)(byte)this_00._M_head_impl[10];
          if (this_00._M_head_impl[10] ==
              (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
               )0x0) {
            uVar19 = 0;
          }
          else {
            iVar21 = *(int *)local_80.root_.
                             super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                             .
                             super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
                             ._M_head_impl.calls;
            iVar23 = 0;
            do {
              iVar21 = iVar21 + 1;
              uVar16 = (int)uVar19 + iVar23 >> 1;
              uVar20 = *(uint *)(this_00._M_head_impl + (long)(int)uVar16 * 8 + 0xc);
              in_R9 = (tuple<int_&> *)(ulong)uVar20;
              TVar9 = (Type)local_48;
              *(int *)_Var8._M_head_impl.calls = iVar21;
              if ((int)uVar20 < (int)TVar9) {
                iVar23 = uVar16 + 1;
              }
              else {
                uVar19 = (ulong)uVar16;
              }
            } while (iVar23 != (int)uVar19);
          }
          _Var12._M_head_impl = this_00._M_head_impl;
          uVar22 = uVar19;
          if (this_00._M_head_impl[0xb] !=
              (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
               )0x0) goto LAB_001d5d21;
        }
      }
LAB_001d6c09:
      pcVar18 = 
      "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
      ;
      goto LAB_001d6c1e;
    }
  }
LAB_001d6c3f:
  pcVar18 = 
  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
  ;
LAB_001d6c1e:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,pcVar18);
  while( true ) {
    paVar14 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                **)_Var12._M_head_impl;
    if (((ulong)paVar14 & 7) != 0) goto LAB_001d6c09;
    pnVar1 = (node_type *)((char *)_Var12._M_head_impl + 8);
    _Var12._M_head_impl =
         (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
          *)paVar14;
    uVar22 = (ulong)(byte)*pnVar1;
    if (*(node_type *)(paVar14->_M_local_buf + 0xb) != (node_type)0x0) break;
LAB_001d5d21:
    uVar20 = (uint)uVar22;
    if (((ulong)_Var12._M_head_impl & 7) != 0) goto LAB_001d6c09;
    if (uVar20 != (byte)*(node_type *)((char *)_Var12._M_head_impl + 10)) {
      TVar9 = (Type)local_48;
      in_R9 = (tuple<int_&> *)(local_48 & 0xffffffff);
      iVar21 = *(int *)((char *)_Var12._M_head_impl + (long)(int)uVar20 * 8 + 0xc);
      *(int *)_Var8._M_head_impl.calls = *(int *)_Var8._M_head_impl.calls + 1;
      if (iVar21 <= (int)TVar9) goto LAB_001d5d84;
      break;
    }
  }
  iter_00._8_8_ = uVar19;
  iter_00.node = this_00._M_head_impl;
  iVar27 = btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::$_0,std::allocator<std::pair<int_const,int>>,256,false>>
           ::
           internal_emplace<std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<int&>>
                     ((btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::__0,std::allocator<std::pair<int_const,int>>,256,false>>
                       *)&local_80,iter_00,(piecewise_construct_t *)&local_c0,
                      (tuple<const_int_&> *)&local_50,in_R9);
  auVar4 = iVar27._0_12_;
LAB_001d5d7f:
  _Var12._M_head_impl = auVar4._0_8_;
  uVar20 = auVar4._8_4_;
LAB_001d5d84:
  local_c0.data_._0_4_ = 0x82;
  local_b8 = (undefined1  [8])local_80.size_;
  local_60.node = _Var12._M_head_impl;
  local_60.position = uVar20;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_a8,"130","m.size()",(int *)&local_c0,(unsigned_long *)local_b8);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if ((undefined8 *)CONCAT44(uStack_9c,uStack_a0) == (undefined8 *)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)CONCAT44(uStack_9c,uStack_a0);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x891,pcVar18);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(ulong *)local_b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_9c,uStack_a0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_9c,uStack_a0));
  }
  if (((ulong)local_80.rightmost_ & 7) == 0) {
    local_b8 = (undefined1  [8])local_80.rightmost_;
    pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(pbStack_b0._4_4_,
                          (uint)(byte)*(node_type *)((long)local_80.rightmost_ + 10));
    btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
    ::operator--((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                  *)local_b8);
    testing::internal::EqHelper::
    Compare<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_nullptr>
              (local_a8,"--m.end()",&local_60,
               (btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                *)local_b8);
    if (local_a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_b8);
      if ((undefined8 *)CONCAT44(uStack_9c,uStack_a0) == (undefined8 *)0x0) {
        pcVar18 = "";
      }
      else {
        pcVar18 = *(char **)CONCAT44(uStack_9c,uStack_a0);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x892,pcVar18);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if (local_b8 != (undefined1  [8])0x0) {
        (**(code **)(*(ulong *)local_b8 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(uStack_9c,uStack_a0) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uStack_9c,uStack_a0));
    }
    local_b8._0_4_ = 2;
    testing::internal::CmpHelperLE<int,int>
              ((internal *)local_a8,"calls","2",&local_88,(int *)local_b8);
    if (local_a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_b8);
      if ((undefined8 *)CONCAT44(uStack_9c,uStack_a0) == (undefined8 *)0x0) {
        pcVar18 = "";
      }
      else {
        pcVar18 = *(char **)CONCAT44(uStack_9c,uStack_a0);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x893,pcVar18);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if (local_b8 != (undefined1  [8])0x0) {
        (**(code **)(*(ulong *)local_b8 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(uStack_9c,uStack_a0) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uStack_9c,uStack_a0));
    }
    local_88 = 0;
    if (((ulong)local_80.rightmost_ & 7) == 0) {
      local_a8._0_4_ = 0x10;
      local_b8._0_4_ = 0x11;
      hint_00.position._0_1_ = local_80.rightmost_[10];
      hint_00.node = local_80.rightmost_;
      hint_00._9_7_ = 0;
      iVar26 = btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
               ::try_emplace<int>((btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                                   *)&local_80,hint_00,(key_type *)local_a8,(int *)local_b8);
      local_60.node = iVar26.node;
      local_60.position = iVar26.position;
      local_c0.data_._0_4_ = 0x82;
      local_b8 = (undefined1  [8])local_80.size_;
      testing::internal::CmpHelperEQ<int,unsigned_long>
                ((internal *)local_a8,"130","m.size()",(int *)&local_c0,(unsigned_long *)local_b8);
      if (local_a8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_b8);
        if ((undefined8 *)CONCAT44(uStack_9c,uStack_a0) == (undefined8 *)0x0) {
          pcVar18 = "";
        }
        else {
          pcVar18 = *(char **)CONCAT44(uStack_9c,uStack_a0);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x898,pcVar18);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_b8 != (undefined1  [8])0x0) {
          (**(code **)(*(ulong *)local_b8 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(uStack_9c,uStack_a0) !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&uStack_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uStack_9c,uStack_a0));
      }
      local_b8._0_4_ = 4;
      testing::internal::CmpHelperGE<int,int>
                ((internal *)local_a8,"calls","4",&local_88,(int *)local_b8);
      if (local_a8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_b8);
        if ((undefined8 *)CONCAT44(uStack_9c,uStack_a0) == (undefined8 *)0x0) {
          pcVar18 = "";
        }
        else {
          pcVar18 = *(char **)CONCAT44(uStack_9c,uStack_a0);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x899,pcVar18);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_b8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_b8 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(uStack_9c,uStack_a0) !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&uStack_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uStack_9c,uStack_a0));
      }
      local_c0.data_._0_4_ = 0x10;
      iVar28 = btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
               ::find<int>((btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                            *)&local_80,(key_arg<int> *)&local_c0);
      local_b8 = (undefined1  [8])iVar28.node;
      pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(pbStack_b0._4_4_,iVar28.position);
      testing::internal::EqHelper::
      Compare<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_nullptr>
                (local_a8,"m.find(16)",&local_60,
                 (btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                  *)local_b8);
      if (local_a8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_b8);
        if ((undefined8 *)CONCAT44(uStack_9c,uStack_a0) == (undefined8 *)0x0) {
          pcVar18 = "";
        }
        else {
          pcVar18 = *(char **)CONCAT44(uStack_9c,uStack_a0);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x89a,pcVar18);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_b8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_b8 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(uStack_9c,uStack_a0) !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&uStack_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uStack_9c,uStack_a0));
      }
      local_88 = 0;
      hint_01.position = local_60.position;
      hint_01.node = local_60.node;
      local_a8._0_4_ = 0x10;
      local_b8._0_4_ = 0x11;
      hint_01._12_4_ = 0;
      iVar26 = btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
               ::try_emplace<int>((btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                                   *)&local_80,hint_01,(key_type *)local_a8,(int *)local_b8);
      local_60.node = iVar26.node;
      local_60.position = iVar26.position;
      local_c0.data_._0_4_ = 0x82;
      local_b8 = (undefined1  [8])local_80.size_;
      testing::internal::CmpHelperEQ<int,unsigned_long>
                ((internal *)local_a8,"130","m.size()",(int *)&local_c0,(unsigned_long *)local_b8);
      if (local_a8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_b8);
        if ((undefined8 *)CONCAT44(uStack_9c,uStack_a0) == (undefined8 *)0x0) {
          pcVar18 = "";
        }
        else {
          pcVar18 = *(char **)CONCAT44(uStack_9c,uStack_a0);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x89f,pcVar18);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_b8 != (undefined1  [8])0x0) {
          (**(code **)(*(ulong *)local_b8 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(uStack_9c,uStack_a0) !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&uStack_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uStack_9c,uStack_a0));
      }
      local_b8._0_4_ = 2;
      testing::internal::CmpHelperLE<int,int>
                ((internal *)local_a8,"calls","2",&local_88,(int *)local_b8);
      if (local_a8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_b8);
        if ((undefined8 *)CONCAT44(uStack_9c,uStack_a0) == (undefined8 *)0x0) {
          pcVar18 = "";
        }
        else {
          pcVar18 = *(char **)CONCAT44(uStack_9c,uStack_a0);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x8a0,pcVar18);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_b8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_b8 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(uStack_9c,uStack_a0) !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&uStack_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uStack_9c,uStack_a0));
      }
      local_c0.data_._0_4_ = 0x10;
      iVar28 = btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
               ::find<int>((btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                            *)&local_80,(key_arg<int> *)&local_c0);
      local_b8 = (undefined1  [8])iVar28.node;
      pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(pbStack_b0._4_4_,iVar28.position);
      testing::internal::EqHelper::
      Compare<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_nullptr>
                (local_a8,"m.find(16)",&local_60,
                 (btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                  *)local_b8);
      if (local_a8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_b8);
        if ((undefined8 *)CONCAT44(uStack_9c,uStack_a0) == (undefined8 *)0x0) {
          pcVar18 = "";
        }
        else {
          pcVar18 = *(char **)CONCAT44(uStack_9c,uStack_a0);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x8a1,pcVar18);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_b8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_b8 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(uStack_9c,uStack_a0) !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&uStack_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uStack_9c,uStack_a0));
      }
      local_c0.data_._0_4_ = 2;
      iVar29 = btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
               ::internal_find<int>(&local_80,(int *)&local_c0);
      uVar13._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )iVar29.node;
      if ((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )uVar13._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
LAB_001d67e6:
        local_c0.data_._0_4_ = 0x81;
        local_b8 = (undefined1  [8])local_80.size_;
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)local_a8,"129","m.size()",(int *)&local_c0,(unsigned_long *)local_b8)
        ;
        if (local_a8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_b8);
          if ((undefined8 *)CONCAT44(uStack_9c,uStack_a0) == (undefined8 *)0x0) {
            pcVar18 = "";
          }
          else {
            pcVar18 = *(char **)CONCAT44(uStack_9c,uStack_a0);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                     ,0x8a4,pcVar18);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          if (local_b8 != (undefined1  [8])0x0) {
            (**(code **)(*(ulong *)local_b8 + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(uStack_9c,uStack_a0) !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&uStack_a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uStack_9c,uStack_a0));
        }
        local_a8._0_4_ = 3;
        iVar28 = btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                 ::find<int>((btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                              *)&local_80,(key_arg<int> *)local_a8);
        local_88 = 0;
        local_a8._0_4_ = 2;
        local_b8._0_4_ = 2;
        btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
        ::try_emplace<int>((btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                            *)&local_80,(const_iterator)iVar28,(key_type *)local_a8,(int *)local_b8)
        ;
        local_c0.data_._0_4_ = 0x82;
        local_b8 = (undefined1  [8])local_80.size_;
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)local_a8,"130","m.size()",(int *)&local_c0,(unsigned_long *)local_b8)
        ;
        if (local_a8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_b8);
          if ((undefined8 *)CONCAT44(uStack_9c,uStack_a0) == (undefined8 *)0x0) {
            pcVar18 = "";
          }
          else {
            pcVar18 = *(char **)CONCAT44(uStack_9c,uStack_a0);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                     ,0x8a9,pcVar18);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          if (local_b8 != (undefined1  [8])0x0) {
            (**(code **)(*(ulong *)local_b8 + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(uStack_9c,uStack_a0) !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&uStack_a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uStack_9c,uStack_a0));
        }
        local_b8._0_4_ = 2;
        testing::internal::CmpHelperLE<int,int>
                  ((internal *)local_a8,"calls","2",&local_88,(int *)local_b8);
        if (local_a8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_b8);
          if ((undefined8 *)CONCAT44(uStack_9c,uStack_a0) == (undefined8 *)0x0) {
            pcVar18 = "";
          }
          else {
            pcVar18 = *(char **)CONCAT44(uStack_9c,uStack_a0);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                     ,0x8aa,pcVar18);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          if (local_b8 != (undefined1  [8])0x0) {
            (**(code **)(*(ulong *)local_b8 + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(uStack_9c,uStack_a0) !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&uStack_a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uStack_9c,uStack_a0));
        }
        pnVar1 = local_80.rightmost_;
        if (((ulong)local_80.root_.
                    super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                    .
                    super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                    .
                    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                    .
                    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                    ._M_head_impl & 7) != 0) goto LAB_001d6c3f;
        if (((ulong)local_80.rightmost_ & 7) == 0) {
          auVar25 = *(undefined1 (*) [8])
                     local_80.root_.
                     super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                     .
                     super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                     ._M_head_impl;
          nVar2 = local_80.rightmost_[10];
          uVar20 = 0;
          auVar24 = auVar25;
          if (auVar25 != (undefined1  [8])local_80.rightmost_ || nVar2 != (node_type)0x0) {
            uStack_a0 = 0;
            local_a8 = auVar25;
            btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
            ::operator++((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                          *)local_a8);
            uVar16 = (uint)(byte)nVar2;
            auVar24 = (undefined1  [8])pnVar1;
            uVar20 = uVar16;
            if (uStack_a0 != uVar16 || local_a8 != (undefined1  [8])pnVar1) {
              uVar17 = 0;
              do {
                uVar6 = uStack_a0;
                auVar5 = local_a8;
                if ((((ulong)local_a8 & 7) != 0) || (((ulong)auVar25 & 7) != 0)) {
                  pcVar18 = 
                  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
                  ;
                  goto LAB_001d6c1e;
                }
                auVar24 = local_a8;
                uVar20 = uStack_a0;
              } while ((*(int *)((long)auVar25 + (long)(int)uVar17 * 8 + 0xc) <=
                        *(int *)((long)local_a8 + (long)(int)uStack_a0 * 8 + 0xc)) &&
                      (((*(int *)((long)auVar25 + (long)(int)uVar17 * 8 + 0xc) <
                         *(int *)((long)local_a8 + (long)(int)uStack_a0 * 8 + 0xc) ||
                        (*(int *)((long)auVar25 + (long)(int)uVar17 * 8 + 0x10) <=
                         *(int *)((long)local_a8 + (long)(int)uStack_a0 * 8 + 0x10))) &&
                       (btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                        ::operator++((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                                      *)local_a8), auVar24 = (undefined1  [8])pnVar1,
                       auVar25 = auVar5, uVar20 = uVar16, uVar17 = uVar6,
                       uStack_a0 != uVar16 || local_a8 != (undefined1  [8])pnVar1))));
            }
          }
          local_b8[0] = uVar20 == (byte)nVar2 && auVar24 == (undefined1  [8])pnVar1;
          pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (uVar20 != (byte)nVar2 || auVar24 != (undefined1  [8])pnVar1) {
            testing::Message::Message((Message *)&local_c0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_a8,(internal *)local_b8,
                       (AssertionResult *)"std::is_sorted(m.begin(), m.end())","false","true",
                       (char *)in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                       ,0x8ac,(char *)local_a8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_50,(Message *)&local_c0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
            if (local_a8 != (undefined1  [8])&local_98) {
              operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
            }
            if (local_c0.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_c0.data_ + 8))();
            }
            if (pbStack_b0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_b0,pbStack_b0);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80.size_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
            ::internal_clear(&local_80,
                             (node_type *)
                             local_80.root_.
                             super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                             .
                             super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                             .
                             super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                             .
                             super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                             ._M_head_impl);
          }
          return;
        }
      }
      else {
        iVar21 = iVar29.position;
        pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(pbStack_b0._4_4_,iVar21);
        local_b8 = (undefined1  [8])
                   uVar13._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
        if (((undefined1  [16])iVar29 & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
          local_81 = *(node_type *)
                      ((long)uVar13._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl + 0xb);
          if (local_81 == (node_type)0x0) {
            btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
            ::operator--((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                          *)local_b8);
            if (((ulong)local_b8 & 7) != 0) goto LAB_001d6c09;
            if (*(node_type *)((long)local_b8 + 0xb) == (node_type)0x0) {
              __assert_fail("iter.node->leaf()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0xa7e,
                            "iterator phmap::priv::btree<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>>::erase(iterator) [Params = phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>]"
                           );
            }
            *(undefined4 *)
             ((node_type *)
              ((long)uVar13._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl + 0xc) + (long)iVar21 * 8) =
                 *(undefined4 *)
                  ((node_type *)((long)local_b8 + 0xc) + (long)(int)(uint)pbStack_b0 * 8);
            iVar29.position =
                 *(undefined4 *)
                  (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)local_b8 + 0x10))->_M_local_buf + (long)(int)(uint)pbStack_b0 * 8);
            iVar29.node = (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                           *)local_b8;
            iVar29._12_4_ = 0;
            *(undefined4 *)
             (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)uVar13._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl + 0x10))->_M_local_buf + (long)iVar21 * 8) =
                 *(undefined4 *)
                  (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)local_b8 + 0x10))->_M_local_buf + (long)(int)(uint)pbStack_b0 * 8);
            iVar21 = (uint)pbStack_b0;
          }
          btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
          ::remove_value(iVar29.node,iVar21,iVar29._8_8_);
          local_80.size_ = local_80.size_ + -1;
          local_a8 = local_b8;
          uStack_a0 = (uint)pbStack_b0;
          local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_b8;
          local_34 = (uint)pbStack_b0;
          if (local_80.root_.
              super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
              .
              super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
              .
              super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
              .
              super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
              ._M_head_impl !=
              (_Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
               )local_b8) {
            bVar11 = true;
            _Var12._M_head_impl =
                 (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  *)local_b8;
            uVar20 = (uint)pbStack_b0;
            do {
              if (((ulong)_Var12._M_head_impl & 7) != 0) goto LAB_001d6c09;
              auVar25 = (undefined1  [8])local_40;
              if (0xe < (byte)((char *)_Var12._M_head_impl)[10]) goto LAB_001d6784;
              pbVar15 = *_Var12._M_head_impl;
              if ((ulong)(byte)((char *)_Var12._M_head_impl)[8] == 0) {
                bVar10 = (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                          )0x0;
LAB_001d6566:
                if (((ulong)pbVar15 & 7) != 0) goto LAB_001d6c09;
                paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)_Var12._M_head_impl;
                if ((byte)bVar10 < (byte)pbVar15[10]) {
                  right = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                          ::child(pbVar15,(ulong)(byte)bVar10 + 1);
                  if (((ulong)right & 7) != 0) goto LAB_001d6c09;
                  if ((right[0xb] !=
                       (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                        )0x0) &&
                     (right[0xb] !=
                      (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                       )0x1e)) {
                    __assert_fail("right->max_count() == kNodeValues",
                                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                                  ,0xbd0,
                                  "bool phmap::priv::btree<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>>::try_merge_or_rebalance(iterator *) [Params = phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>]"
                                 );
                  }
                  bVar3 = ((char *)_Var12._M_head_impl)[10];
                  bVar10 = right[10];
                  if ((uint)bVar3 + (uint)(byte)bVar10 + 1 < 0x1f) {
                    uVar16 = 1;
                    btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                    ::merge_nodes(&local_80,_Var12._M_head_impl,right);
                    goto LAB_001d6684;
                  }
                  if (((byte)bVar10 < 0x10) || ((bVar3 != 0 && ((int)uVar20 < 1))))
                  goto LAB_001d65fb;
                  uVar17 = (int)(short)(((ushort)(byte)bVar10 - (ushort)bVar3) -
                                       ((short)((ushort)(byte)bVar10 - (ushort)bVar3) >> 0xf)) >> 1;
                  uVar16 = (byte)bVar10 - 1;
                  if ((int)uVar17 <= (int)((byte)bVar10 - 1)) {
                    uVar16 = uVar17;
                  }
                  btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  ::rebalance_right_to_left
                            (_Var12._M_head_impl,uVar16,right,(allocator_type *)(ulong)uVar17);
                }
                else {
LAB_001d65fb:
                  if ((ulong)(byte)((char *)_Var12._M_head_impl)[8] != 0) {
                    pbVar15 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                              ::child(pbVar15,(ulong)(byte)((char *)_Var12._M_head_impl)[8] - 1);
                    if (((ulong)pbVar15 & 7) != 0) goto LAB_001d6c09;
                    bVar10 = pbVar15[10];
                    uVar16 = 0;
                    if ((byte)bVar10 < 0x10) goto LAB_001d6684;
                    if ((((char *)_Var12._M_head_impl)[10] == 0) ||
                       (uVar16 = (uint)(byte)((char *)_Var12._M_head_impl)[10],
                       (int)uVar20 < (int)uVar16)) {
                      uVar16 = (byte)bVar10 - uVar16;
                      uVar17 = (int)(short)((short)((uVar16 & 0xffff) >> 0xf) + (short)uVar16) >> 1;
                      uVar16 = (byte)bVar10 - 1;
                      if ((int)uVar17 <= (int)((byte)bVar10 - 1)) {
                        uVar16 = uVar17;
                      }
                      btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                      ::rebalance_left_to_right
                                (pbVar15,uVar16,_Var12._M_head_impl,(allocator_type *)(ulong)uVar17)
                      ;
                      uVar20 = uVar20 + uVar16;
                    }
                  }
                }
                uVar16 = 0;
              }
              else {
                paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                             ::child(pbVar15,(ulong)(byte)((char *)_Var12._M_head_impl)[8] - 1);
                if (((ulong)paVar14 & 7) != 0) goto LAB_001d6c09;
                if ((*(btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                       *)(paVar14->_M_local_buf + 0xb) !=
                     (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                      )0x0) &&
                   (*(btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                      *)(paVar14->_M_local_buf + 0xb) !=
                    (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                     )0x1e)) {
                  __assert_fail("left->max_count() == kNodeValues",
                                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                                ,0xbc5,
                                "bool phmap::priv::btree<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>>::try_merge_or_rebalance(iterator *) [Params = phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>]"
                               );
                }
                bVar10 = *(btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                           *)(paVar14->_M_local_buf + 10);
                if (0x1e < (uint)(byte)((char *)_Var12._M_head_impl)[10] + (uint)(byte)bVar10 + 1) {
                  bVar10 = _Var12._M_head_impl[8];
                  goto LAB_001d6566;
                }
                btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                ::merge_nodes(&local_80,(node_type *)paVar14->_M_local_buf,_Var12._M_head_impl);
                uVar20 = (byte)bVar10 + 1 + uVar20;
                uVar16 = 1;
              }
LAB_001d6684:
              if (bVar11) {
                local_a8 = (undefined1  [8])paVar14;
                uStack_a0 = uVar20;
                local_40 = paVar14;
                local_34 = uVar20;
              }
              auVar25 = (undefined1  [8])local_40;
              if ((char)uVar16 == '\0') goto LAB_001d6784;
              uVar20 = (uint)(byte)*(node_type *)(paVar14->_M_local_buf + 8);
              _Var12._M_head_impl =
                   *(btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                     **)paVar14;
              bVar11 = false;
            } while ((_Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                      )_Var12._M_head_impl !=
                     (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                      )local_80.root_.
                       super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                       .
                       super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                       .
                       super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                       .
                       super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                       ._M_head_impl);
          }
          auVar25 = (undefined1  [8])local_40;
          if (((ulong)local_80.root_.
                      super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                      .
                      super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                      .
                      super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                      .
                      super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                      ._M_head_impl & 7) == 0) {
            if (*(btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  *)((long)local_80.root_.
                           super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                           .
                           super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                           .
                           super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                           .
                           super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                           ._M_head_impl + 10) ==
                (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                 )0x0) {
              if (*(btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                    *)((long)local_80.root_.
                             super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                             .
                             super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                             .
                             super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                             .
                             super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                             ._M_head_impl + 0xb) ==
                  (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                   )0x0) {
                alloc = (allocator_type *)0x0;
                paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                             ::child((btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                                      *)local_80.root_.
                                        super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                                        .
                                        super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                                        .
                                        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                                        .
                                        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                                        ._M_head_impl,0);
                if (((ulong)paVar14 & 7) == 0) {
                  bVar11 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                           ::is_root((btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                                      *)paVar14->_M_allocated_capacity);
                  _Var7.
                  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                  .
                  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                  ._M_head_impl =
                       (_Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                        )(_Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                          )local_80.root_.
                           super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                           .
                           super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                  ;
                  if (!bVar11) {
                    __assert_fail("parent()->is_root()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                                  ,0x4ad,
                                  "void phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>>::make_root() [Params = phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>]"
                                 );
                  }
                  if (((ulong)paVar14->_M_allocated_capacity & 7) == 0) {
                    paVar14->_M_allocated_capacity = *(size_type *)paVar14->_M_allocated_capacity;
                    btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                    ::destroy((btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                               *)local_80.root_.
                                 super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                                 .
                                 super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                                 .
                                 super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                                 .
                                 super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                                 ._M_head_impl,alloc);
                    operator_delete((void *)_Var7.
                                            super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                                            .
                                            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                                            ._M_head_impl,0x1f8);
                    auVar25 = (undefined1  [8])local_40;
                    local_80.root_.
                    super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                    .
                    super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                    .
                    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                    .
                    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                    ._M_head_impl =
                         (_Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                          )(_Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                            )paVar14;
                    goto LAB_001d677c;
                  }
                }
                goto LAB_001d6c3f;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80.size_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                __assert_fail("size() == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                              ,0xbfc,
                              "void phmap::priv::btree<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>>::try_shrink() [Params = phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>]"
                             );
              }
              btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              ::delete_leaf_node(&local_80,
                                 (node_type *)
                                 local_80.root_.
                                 super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                                 .
                                 super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                                 .
                                 super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                                 .
                                 super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                                 ._M_head_impl);
              local_80.root_.
              super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
              .
              super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
              .
              super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
              .
              super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
              ._M_head_impl =
                   (_Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                    )&btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::$_0,std::allocator<std::pair<int_const,int>>,256,false>>
                      ::EmptyNode()::empty_node;
              local_80.rightmost_ =
                   (node_type *)
                   &btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::$_0,std::allocator<std::pair<int_const,int>>,256,false>>
                    ::EmptyNode()::empty_node;
            }
LAB_001d677c:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80.size_ ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              if (((ulong)local_80.rightmost_ & 7) == 0) {
                uStack_a0 = (uint)(byte)local_80.rightmost_[10];
                auVar25 = (undefined1  [8])local_80.rightmost_;
                goto LAB_001d67cc;
              }
            }
            else {
LAB_001d6784:
              if (((ulong)auVar25 & 7) == 0) {
                uStack_a0 = local_34;
                if (local_34 == (byte)*(node_type *)((long)auVar25 + 10)) {
                  uStack_a0 = local_34 - 1;
                  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                  ::operator++((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                                *)local_a8);
                  auVar25 = local_a8;
                }
LAB_001d67cc:
                local_a8 = auVar25;
                if (local_81 == (node_type)0x0) {
                  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                  ::operator++((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                                *)local_a8);
                }
                goto LAB_001d67e6;
              }
            }
          }
        }
      }
    }
  }
  goto LAB_001d6c09;
}

Assistant:

TEST(Btree, TryEmplaceWithHintWorks) {
        // Use a counting comparator here to verify that hint is used.
        int calls = 0;
        auto cmp = [&calls](int x, int y) {
            ++calls;
            return x < y;
        };
        using Cmp = decltype(cmp);

        phmap::btree_map<int, int, Cmp> m(cmp);
        for (int i = 0; i < 128; ++i) {
            m.emplace(i, i);
        }

        // Sanity check for the comparator
        calls = 0;
        m.emplace(127, 127);
        EXPECT_GE(calls, 4);

        // Try with begin hint:
        calls = 0;
        auto it = m.try_emplace(m.begin(), -1, -1);
        EXPECT_EQ(129, m.size());
        EXPECT_EQ(it, m.begin());
        EXPECT_LE(calls, 2);

        // Try with end hint:
        calls = 0;
        std::pair<int, int> pair1024 = {1024, 1024};
        it = m.try_emplace(m.end(), pair1024.first, pair1024.second);
        EXPECT_EQ(130, m.size());
        EXPECT_EQ(it, --m.end());
        EXPECT_LE(calls, 2);

        // Try value already present, bad hint; ensure no duplicate added:
        calls = 0;
        it = m.try_emplace(m.end(), 16, 17);
        EXPECT_EQ(130, m.size());
        EXPECT_GE(calls, 4);
        EXPECT_EQ(it, m.find(16));

        // Try value already present, hint points directly to it:
        calls = 0;
        it = m.try_emplace(it, 16, 17);
        EXPECT_EQ(130, m.size());
        EXPECT_LE(calls, 2);
        EXPECT_EQ(it, m.find(16));

        m.erase(2);
        EXPECT_EQ(129, m.size());
        auto hint = m.find(3);
        // Try emplace in the middle of two other elements.
        calls = 0;
        m.try_emplace(hint, 2, 2);
        EXPECT_EQ(130, m.size());
        EXPECT_LE(calls, 2);

        EXPECT_TRUE(std::is_sorted(m.begin(), m.end()));
    }